

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

uint peek_imm_32(m68k_info *info)

{
  uint uVar1;
  m68k_info *in_stack_00000008;
  
  uVar1 = m68k_read_safe_32(in_stack_00000008,(uint64_t)info);
  return uVar1;
}

Assistant:

static unsigned int peek_imm_32(const m68k_info *info) { return m68k_read_safe_32((info), (info)->pc); }